

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

uint16_t client_get_active_border_width(theme *theme,client *client)

{
  client *client_local;
  theme *theme_local;
  
  if ((client->is_fullscreen & 1U) == 0) {
    if ((client->state & CLIENT_URGENT) == 0) {
      if ((client->state & CLIENT_STICKY) == 0) {
        if ((client->state & CLIENT_OFF_SCREEN) == 0) {
          if ((client->is_focused & 1U) == 0) {
            theme_local._6_2_ = theme->border_width->unfocused;
          }
          else {
            theme_local._6_2_ = theme->border_width->focused;
          }
        }
        else {
          theme_local._6_2_ = theme->border_width->unfocused;
        }
      }
      else {
        theme_local._6_2_ = theme->border_width->sticky;
      }
    }
    else {
      theme_local._6_2_ = theme->border_width->urgent;
    }
  }
  else {
    theme_local._6_2_ = 0;
  }
  return theme_local._6_2_;
}

Assistant:

uint16_t client_get_active_border_width(const struct theme *theme, const struct client *client)
{
        if (client->is_fullscreen) {
                return 0;
        }

        if (client->state & CLIENT_URGENT) {
                return theme->border_width->urgent;
        }

        if (client->state & CLIENT_STICKY) {
                return theme->border_width->sticky;
        }

        if (client->state & CLIENT_OFF_SCREEN) {
                return theme->border_width->unfocused;
        }

        if (client->is_focused) {
                return theme->border_width->focused;
        }

        return theme->border_width->unfocused;
}